

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Index::Index
          (Index *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *dot_fodder,
          bool is_slice,AST *index,Fodder *end_colon_fodder,AST *end,Fodder *step_colon_fodder,
          AST *step,Fodder *id_fodder)

{
  byte bVar1;
  undefined8 in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  undefined8 *in_RDI;
  byte in_R9B;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000028;
  Fodder *in_stack_ffffffffffffffb8;
  ASTType in_stack_ffffffffffffffc4;
  LocationRange *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  AST::AST((AST *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
           in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__Index_003d3920;
  in_RDI[0x10] = in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  *(byte *)(in_RDI + 0x14) = bVar1 & 1;
  in_RDI[0x15] = in_stack_00000008;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  in_RDI[0x19] = in_stack_00000018;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  in_RDI[0x1d] = in_stack_00000028;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  in_RDI[0x21] = 0;
  return;
}

Assistant:

Index(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &dot_fodder,
          bool is_slice, AST *index, const Fodder &end_colon_fodder, AST *end,
          const Fodder &step_colon_fodder, AST *step, const Fodder &id_fodder)
        : AST(lr, AST_INDEX, open_fodder),
          target(target),
          dotFodder(dot_fodder),
          isSlice(is_slice),
          index(index),
          endColonFodder(end_colon_fodder),
          end(end),
          stepColonFodder(step_colon_fodder),
          step(step),
          idFodder(id_fodder),
          id(nullptr)
    {
    }